

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O2

unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
 __thiscall lrit::File::getData(File *this)

{
  long in_RSI;
  undefined1 auVar1 [16];
  string sStack_38;
  
  if (*(long *)(in_RSI + 8) == 0) {
    if (*(long *)(in_RSI + 0x20) == *(long *)(in_RSI + 0x28)) {
      auVar1 = __cxa_allocate_exception(0x10);
      util::str_abi_cxx11_(&sStack_38,(util *)"unreachable",auVar1._8_8_);
      std::runtime_error::runtime_error(auVar1._0_8_,(string *)&sStack_38);
      __cxa_throw(auVar1._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    getDataFromBuffer(this);
  }
  else {
    getDataFromFile(this);
  }
  return (__uniq_ptr_data<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<std::istream> File::getData() const {
  if (!file_.empty()) {
    return getDataFromFile();
  }
  if (!buf_.empty()) {
    return getDataFromBuffer();
  }
  ERROR("unreachable");
}